

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ImmediatePromiseNode<kj::_::Void>::ImmediatePromiseNode
          (ImmediatePromiseNode<kj::_::Void> *this,ExceptionOr<kj::_::Void> *result)

{
  ImmediatePromiseNodeBase::ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00580218;
  ExceptionOr<kj::_::Void>::ExceptionOr(&this->result,result);
  return;
}

Assistant:

ImmediatePromiseNode(ExceptionOr<T>&& result): result(kj::mv(result)) {}